

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Common.cpp
# Opt level: O3

error<idx2::idx2_err_code>
idx2::TraverseHierarchy
          (u64 TraverseOrder,v3i *From3,v3i *Dims3,extent *Extent,extent *VolExtent,
          traverse_callback *Callback)

{
  anon_union_8_4_6ba14846_for_v2<int>_1 *paVar1;
  ulong *puVar2;
  byte *pbVar3;
  u64 uVar4;
  char cVar5;
  ulong uVar6;
  undefined8 uVar7;
  anon_union_8_4_6ba14846_for_v2<int>_1 aVar8;
  anon_union_8_4_6ba14846_for_v2<int>_1 aVar9;
  anon_union_8_4_6ba14846_for_v2<int>_1 aVar10;
  undefined1 auVar11 [16];
  uint uVar12;
  i64 iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  u64 uVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  long *in_FS_OFFSET;
  bool bVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  error<idx2::idx2_err_code> eVar30;
  extent eVar31;
  traverse_item Second;
  traverse_item First;
  extent Skip;
  anon_union_12_8_3dedac88_for_v3<int>_1 local_178;
  anon_union_12_8_3dedac88_for_v3<int>_1 aStack_16c;
  undefined5 uStack_160;
  uint3 uStack_15b;
  undefined5 local_158;
  undefined3 uStack_153;
  undefined5 local_150;
  undefined3 uStack_14b;
  int local_148;
  uint local_144;
  int local_138;
  int local_134;
  int local_130;
  uint local_12c;
  array<idx2::traverse_item> local_128;
  extent *local_f0;
  extent *local_e8;
  traverse_callback *local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  int iStack_c8;
  int iStack_c4;
  undefined5 uStack_c0;
  uint3 uStack_bb;
  undefined5 uStack_b8;
  undefined3 uStack_b3;
  undefined5 uStack_b0;
  undefined3 uStack_ab;
  int iStack_a8;
  uint uStack_a4;
  undefined8 local_98;
  undefined8 uStack_90;
  int iStack_88;
  int iStack_84;
  undefined5 uStack_80;
  uint3 uStack_7b;
  undefined5 uStack_78;
  undefined3 uStack_73;
  undefined5 uStack_70;
  undefined3 uStack_6b;
  int iStack_68;
  uint uStack_64;
  extent local_58;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_f0 = Extent;
  local_e8 = VolExtent;
  local_e0 = Callback;
  if (Mallocator()::Instance == '\0') {
    TraverseHierarchy();
  }
  if (Mallocator()::Instance == '\0') {
    TraverseHierarchy();
  }
  local_128.Buffer.Data = (byte *)0x0;
  local_128.Buffer.Bytes = 0;
  local_128.Buffer.Alloc = (allocator *)&Mallocator()::Instance;
  local_128.Size = 0;
  local_128.Capacity = 0;
  local_128.Alloc = (allocator *)&Mallocator()::Instance;
  GrowCapacity<idx2::traverse_item>(&local_128,0x40);
  lVar19 = (long)(Dims3->field_0).field_0.X;
  iVar18 = 1;
  iVar15 = 1;
  if (lVar19 != 0) {
    uVar20 = lVar19 - 1;
    lVar19 = 0x3f;
    if (uVar20 != 0) {
      for (; uVar20 >> lVar19 == 0; lVar19 = lVar19 + -1) {
      }
    }
    iVar15 = 1;
    if (uVar20 != 0) {
      iVar15 = (int)(1L << (-((byte)lVar19 ^ 0x3f) & 0x3f));
    }
  }
  lVar19 = (long)(Dims3->field_0).field_0.Y;
  if (lVar19 != 0) {
    uVar20 = lVar19 - 1;
    lVar19 = 0x3f;
    if (uVar20 != 0) {
      for (; uVar20 >> lVar19 == 0; lVar19 = lVar19 + -1) {
      }
    }
    iVar18 = 1;
    if (uVar20 != 0) {
      iVar18 = (int)(1L << (-((byte)lVar19 ^ 0x3f) & 0x3f));
    }
  }
  lVar19 = (long)(Dims3->field_0).field_0.Z;
  if (lVar19 == 0) {
    iVar14 = 1;
  }
  else {
    uVar20 = lVar19 - 1;
    lVar19 = 0x3f;
    if (uVar20 != 0) {
      for (; uVar20 >> lVar19 == 0; lVar19 = lVar19 + -1) {
      }
    }
    iVar14 = 1;
    if (uVar20 != 0) {
      iVar14 = (int)(1L << (-((byte)lVar19 ^ 0x3f) & 0x3f));
    }
  }
  local_150 = 0;
  uStack_14b = 0;
  local_148 = 0;
  local_144 = local_144 & 0xffffff00;
  local_178.field_3.XY.field_0 = (v2<int>)(From3->field_0).field_3.XY.field_0;
  local_178.field_0.Z = (From3->field_0).field_0.Z;
  aStack_16c.field_0.X = iVar15 + (From3->field_0).field_0.X;
  aStack_16c.field_0.Y = iVar18 + (From3->field_0).field_0.Y;
  aStack_16c.field_0.Z = iVar14 + (From3->field_0).field_0.Z;
  local_158 = (undefined5)TraverseOrder;
  uStack_153 = (undefined3)(TraverseOrder >> 0x28);
  iVar13 = local_128.Size;
  uStack_160 = local_158;
  uStack_15b = uStack_153;
  if (local_128.Capacity <= local_128.Size) {
    GrowCapacity<idx2::traverse_item>(&local_128,0);
    iVar13 = local_128.Size;
  }
  local_128.Size = iVar13 + 1;
  aVar8.field_0.Y = aStack_16c.field_0.X;
  aVar8.field_0.X = local_178.field_0.Z;
  aVar9.field_0.Y = aStack_16c.field_0.Z;
  aVar9.field_0.X = aStack_16c.field_0.Y;
  aVar10.field_0.Y._1_3_ = uStack_15b;
  aVar10._0_5_ = uStack_160;
  pbVar3 = local_128.Buffer.Data + iVar13 * 0x38 + 0x15;
  *(ulong *)pbVar3 = CONCAT53(uStack_160,aStack_16c.field_0.Z._1_3_);
  *(ulong *)(pbVar3 + 8) = CONCAT53(local_158,uStack_15b);
  *(ulong *)(pbVar3 + 0x10) = CONCAT53(local_150,uStack_153);
  *(ulong *)(pbVar3 + 0x18) = CONCAT17((undefined1)local_144,CONCAT43(local_148,uStack_14b));
  local_48 = 1;
  uStack_44 = 1;
  uStack_40 = 1;
  uStack_3c = 1;
  paVar1 = (anon_union_8_4_6ba14846_for_v2<int>_1 *)(local_128.Buffer.Data + iVar13 * 0x38);
  paVar1->field_0 =
       (anon_struct_8_2_94730de6_for_anon_union_8_4_6ba14846_for_v2<int>_1_0)
       local_178.field_3.XY.field_0;
  paVar1[1] = aVar8;
  paVar1[2] = aVar9;
  paVar1[3] = aVar10;
  do {
    while( true ) {
      do {
        lVar19 = local_128.Size + -1;
        lVar21 = lVar19 * 0x38;
        puVar2 = (ulong *)(local_128.Buffer.Data + lVar21);
        local_178._0_8_ = *puVar2;
        uVar20 = puVar2[1];
        uVar6 = puVar2[3];
        uVar7 = *(undefined8 *)(local_128.Buffer.Data + lVar21 + 0x2d);
        local_158 = (undefined5)
                    ((ulong)*(undefined8 *)(local_128.Buffer.Data + lVar21 + 0x1d) >> 0x18);
        uStack_153 = (undefined3)*(undefined8 *)(local_128.Buffer.Data + lVar21 + 0x25);
        local_150 = (undefined5)
                    ((ulong)*(undefined8 *)(local_128.Buffer.Data + lVar21 + 0x25) >> 0x18);
        uStack_14b = (undefined3)uVar7;
        local_148 = (int)((ulong)uVar7 >> 0x18);
        local_144._0_1_ = (undefined1)((ulong)uVar7 >> 0x38);
        local_178.field_0.Z = (int)uVar20;
        aStack_16c.field_0.X = (int)(uVar20 >> 0x20);
        aStack_16c.field_0.Y = (int)puVar2[2];
        aStack_16c.field_0.Z = (int)(puVar2[2] >> 0x20);
        uStack_160 = (undefined5)(uVar6 >> 2);
        uStack_15b = (uint3)(uVar6 >> 0x2a);
        uVar12 = (uint)uVar6 & 3;
      } while (uVar12 == 3);
      bVar27 = local_128.Size == 0;
      if (!bVar27) {
        local_128.Size = lVar19;
      }
      auVar28._4_4_ = aStack_16c.field_0.Y;
      auVar28._0_4_ = aStack_16c.field_0.X;
      auVar28._8_8_ = 0;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_178.field_3.XY.field_0;
      auVar28 = vpsubd_avx(auVar28,auVar29);
      auVar11._4_4_ = uStack_44;
      auVar11._0_4_ = local_48;
      auVar11._8_4_ = uStack_40;
      auVar11._12_4_ = uStack_3c;
      auVar28 = vpcmpeqd_avx(auVar28,auVar11);
      auVar28 = vpmovsxdq_avx(auVar28);
      uVar16 = vmovmskpd_avx(auVar28);
      if ((((uVar16 & 1) != 0) && ((byte)((byte)uVar16 >> 1) != 0)) &&
         (aStack_16c.field_0.Z - local_178._8_4_ == 1)) break;
      uStack_78 = local_158;
      uStack_73 = uStack_153;
      uStack_70 = local_150;
      uStack_6b = uStack_14b;
      iStack_68 = local_148;
      uStack_64 = local_144;
      local_98 = local_178._0_8_;
      uStack_90 = uVar20;
      uStack_80 = uStack_160;
      uStack_7b = uStack_15b;
      uStack_b8 = local_158;
      uStack_b3 = uStack_153;
      uStack_b0 = local_150;
      uStack_ab = uStack_14b;
      iStack_a8 = local_148;
      uStack_a4 = local_144;
      local_d8 = (ulong)local_178.field_3.XY.field_0;
      uStack_d0 = uVar20;
      uStack_c0 = uStack_160;
      uStack_bb = uStack_15b;
      uVar20 = (ulong)(uVar12 << 2);
      iVar18 = (*(int *)((long)&aStack_16c + uVar20) - *(int *)((long)&local_178 + uVar20)) / 2 +
               *(int *)((long)&local_178 + uVar20);
      iStack_88 = aStack_16c.field_0.Y;
      iStack_84 = aStack_16c.field_0.Z;
      *(int *)((long)&uStack_90 + uVar20 + 4) = iVar18;
      iStack_c8 = aStack_16c.field_0.Y;
      iStack_c4 = aStack_16c.field_0.Z;
      *(int *)((long)&local_d8 + uVar20) = iVar18;
      iVar15 = iStack_68;
      iVar18 = (int)local_98;
      uVar12 = local_98._4_4_;
      local_130 = uStack_90._4_4_;
      uVar16 = uStack_90._4_4_ - (int)local_98;
      local_134 = iStack_88;
      uVar25 = iStack_88 - local_98._4_4_;
      local_138 = iStack_84;
      uVar26 = iStack_84 - (uint)uStack_90;
      local_12c = (uint)uStack_90;
      local_58.From =
           (ulong)((uint)uStack_90 & 0x1fffff) << 0x2a |
           ((ulong)local_98._4_4_ & 0x1fffff) << 0x15 | local_98 & 0x1fffff;
      local_58.Dims =
           (ulong)(uVar26 & 0x1fffff) << 0x2a |
           (ulong)(uVar25 & 0x1fffff) << 0x15 | (ulong)(uVar16 & 0x1fffff);
      eVar31 = Crop<idx2::extent,idx2::extent>(&local_58,local_e8);
      iStack_a8 = (((int)eVar31.Dims << 0xb) >> 0xb) * (int)((long)(eVar31.Dims * 2) >> 0x2b) *
                  (int)((long)(eVar31.Dims << 0x16) >> 0x2b) + iVar15;
      uStack_70 = local_150;
      uStack_6b = uStack_14b;
      lVar19 = (long)(int)uVar26 * (long)(int)uVar25 * (long)(int)uVar16 +
               CONCAT35(uStack_14b,local_150);
      uStack_b0 = (undefined5)lVar19;
      uStack_ab = (undefined3)((ulong)lVar19 >> 0x28);
      uVar4 = local_f0->From;
      uVar22 = local_f0->Dims;
      iVar14 = (int)((long)(uVar4 << 0x2b) >> 0x2b);
      iVar15 = (int)((long)(uVar4 * 2) >> 0x2b);
      iVar17 = (int)((long)(uVar4 << 0x16) >> 0x2b);
      iVar23 = (int)(((long)(uVar22 << 0x16) >> 0xb) +
                     ((long)(uVar4 << 0x16) >> 0xb & 0xffffffff00000000U) >> 0x20);
      iVar24 = (((int)uVar22 << 0xb) >> 0xb) + iVar14;
      if (((((int)local_d8 < iVar24) && (local_d8._4_4_ < iVar23)) &&
          (((int)uStack_d0 < (int)((long)(uVar22 * 2) >> 0x2b) + iVar15 &&
           ((iVar14 < uStack_d0._4_4_ && (iVar17 < iStack_c8)))))) && (iVar15 < iStack_c4)) {
        iVar13 = local_128.Size;
        if (local_128.Capacity <= local_128.Size) {
          GrowCapacity<idx2::traverse_item>(&local_128,0);
          iVar13 = local_128.Size;
        }
        local_128.Size = iVar13 + 1;
        pbVar3 = local_128.Buffer.Data + iVar13 * 0x38 + 0x15;
        *(ulong *)pbVar3 = CONCAT53(uStack_c0,iStack_c4._1_3_);
        *(ulong *)(pbVar3 + 8) = CONCAT53(uStack_b8,uStack_bb);
        *(ulong *)(pbVar3 + 0x10) = CONCAT53(uStack_b0,uStack_b3);
        *(ulong *)(pbVar3 + 0x18) = CONCAT17((undefined1)uStack_a4,CONCAT43(iStack_a8,uStack_ab));
        puVar2 = (ulong *)(local_128.Buffer.Data + iVar13 * 0x38);
        *puVar2 = local_d8;
        puVar2[1] = uStack_d0;
        puVar2[2] = CONCAT44(iStack_c4,iStack_c8);
        puVar2[3] = CONCAT35(uStack_bb,uStack_c0);
        uVar4 = local_f0->From;
        uVar22 = local_f0->Dims;
        iVar14 = (int)((long)(uVar4 << 0x2b) >> 0x2b);
        iVar15 = (int)((long)(uVar4 * 2) >> 0x2b);
        iVar17 = (int)((long)(uVar4 << 0x16) >> 0x2b);
        iVar23 = (int)(((long)(uVar22 << 0x16) >> 0xb) +
                       ((long)(uVar4 << 0x16) >> 0xb & 0xffffffff00000000U) >> 0x20);
        iVar24 = (((int)uVar22 << 0xb) >> 0xb) + iVar14;
      }
      if (((((iVar18 < iVar24) && ((int)uVar12 < iVar23)) &&
           ((int)local_12c < (int)((long)(uVar22 * 2) >> 0x2b) + iVar15)) &&
          ((iVar14 < local_130 && (iVar17 < local_134)))) && (iVar15 < local_138)) {
        iVar13 = local_128.Size;
        if (local_128.Capacity <= local_128.Size) {
          GrowCapacity<idx2::traverse_item>(&local_128,0);
          iVar13 = local_128.Size;
        }
        local_128.Size = iVar13 + 1;
        pbVar3 = local_128.Buffer.Data + iVar13 * 0x38 + 0x15;
        *(ulong *)pbVar3 = CONCAT53(uStack_80,iStack_84._1_3_);
        *(ulong *)(pbVar3 + 8) = CONCAT53(uStack_78,uStack_7b);
        *(ulong *)(pbVar3 + 0x10) = CONCAT53(uStack_70,uStack_73);
        *(ulong *)(pbVar3 + 0x18) = CONCAT17((undefined1)uStack_64,CONCAT43(iStack_68,uStack_6b));
        puVar2 = (ulong *)(local_128.Buffer.Data + iVar13 * 0x38);
        *puVar2 = local_98;
        puVar2[1] = uStack_90;
        puVar2[2] = CONCAT44(iStack_84,iStack_88);
        puVar2[3] = CONCAT35(uStack_7b,uStack_80);
      }
    }
    local_144 = CONCAT31(local_144._1_3_,bVar27 || lVar19 == 0);
    eVar30 = (*local_e0)((traverse_item *)&local_178.field_0);
  } while (eVar30.Code == NoError);
  cVar5 = eVar30.StackIdx;
  if (cVar5 < '@') {
    *(undefined4 *)(*in_FS_OFFSET + -0xf7c + (long)cVar5 * 4) = 0x35d;
    *(char **)(*in_FS_OFFSET + -0xe78 + (long)cVar5 * 8) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
    ;
    (*(local_128.Alloc)->_vptr_allocator[1])();
    eVar30._8_8_ = (ulong)(byte)(cVar5 + 1) << 8 | (ulong)(eVar30._8_4_ & 0xff00ff);
    return eVar30;
  }
  __assert_fail("false && \"stack too deep\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
                ,0x35d,
                "auto idx2::TraverseHierarchy(u64, const v3i &, const v3i &, const extent &, const extent &, traverse_callback *)::(anonymous class)::operator()() const"
               );
}

Assistant:

error<idx2_err_code>
TraverseHierarchy(u64 TraverseOrder,
                  const v3i& From3,
                  const v3i& Dims3,
                  const extent& Extent, // in units of traverse_item
                  const extent& VolExtent, // in units of traverse_item
                  traverse_callback Callback)
{
  idx2_RAII(array<traverse_item>, Stack, Reserve(&Stack, 64), Dealloc(&Stack));
  v3i Dims3Ext((int)NextPow2(Dims3.X), (int)NextPow2(Dims3.Y), (int)NextPow2(Dims3.Z));
  traverse_item Top;
  Top.From3 = From3;
  Top.To3 = From3 + Dims3Ext;
  Top.TraverseOrder = Top.PrevTraverseOrder = TraverseOrder;
  PushBack(&Stack, Top);
  while (Size(Stack) >= 0)
  {
    Top = Back(Stack);
    int FD = Top.TraverseOrder & 0x3;
    Top.TraverseOrder >>= 2;
    if (FD == 3)
    {
      if (Top.TraverseOrder == 3)
        Top.TraverseOrder = Top.PrevTraverseOrder;
      else
        Top.PrevTraverseOrder = Top.TraverseOrder;
      continue;
    }
    PopBack(&Stack);
    if (!(Top.To3 - Top.From3 == 1))
    {
      traverse_item First = Top, Second = Top;
      First.To3[FD] =
        Top.From3[FD] + (Top.To3[FD] - Top.From3[FD]) / 2;
      Second.From3[FD] =
        Top.From3[FD] + (Top.To3[FD] - Top.From3[FD]) / 2;
      extent Skip(First.From3, First.To3 - First.From3);
      //Second.NItemsBefore = First.NItemsBefore + Prod<u64>(Dims(Crop(Skip, Extent)));
      Second.ItemOrder = First.ItemOrder + Prod<i32>(Dims(Crop(Skip, VolExtent)));
      First.Address = Top.Address;
      Second.Address = Top.Address + Prod<u64>(First.To3 - First.From3);
      if (Second.From3 < To(Extent) && From(Extent) < Second.To3)
        PushBack(&Stack, Second);
      if (First.From3 < To(Extent) && From(Extent) < First.To3)
        PushBack(&Stack, First);
    }
    else
    {
      Top.LastItem = Size(Stack) == 0;
      idx2_PropagateIfError(Callback(Top));
    }
  }
}